

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void __thiscall llvm::APInt::ashrSlowCase(APInt *this,uint ShiftAmt)

{
  ulong *puVar1;
  uint64_t *puVar2;
  bool bVar3;
  byte bVar4;
  sbyte sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  if (ShiftAmt != 0) {
    bVar3 = operator[](this,this->BitWidth - 1);
    uVar12 = ShiftAmt >> 6;
    iVar6 = (int)((ulong)this->BitWidth + 0x3f >> 6);
    uVar11 = iVar6 - uVar12;
    if (uVar11 != 0) {
      uVar7 = iVar6 - 1;
      bVar4 = -(char)this->BitWidth;
      (this->U).pVal[uVar7] = (long)((this->U).pVal[uVar7] << (bVar4 & 0x3f)) >> (bVar4 & 0x3f);
      if ((ShiftAmt & 0x3f) == 0) {
        memmove((this->U).pVal,(this->U).pVal + uVar12,(ulong)(uVar11 * 8));
      }
      else {
        uVar8 = (ulong)(uVar11 - 1);
        sVar5 = (sbyte)(ShiftAmt & 0x3f);
        if (uVar11 - 1 != 0) {
          lVar9 = 0;
          uVar10 = (ulong)uVar12;
          do {
            puVar2 = (this->U).pVal;
            puVar1 = puVar2 + uVar10;
            uVar10 = (ulong)((int)uVar10 + 1);
            *(uint64_t *)((long)puVar2 + lVar9) =
                 puVar2[uVar10] << (0x40U - sVar5 & 0x3f) | *puVar1 >> sVar5;
            lVar9 = lVar9 + 8;
          } while (uVar8 * 8 - lVar9 != 0);
        }
        (this->U).pVal[uVar8] = (this->U).pVal[uVar7] >> sVar5;
        (this->U).pVal[uVar8] = (long)((this->U).pVal[uVar8] << sVar5) >> sVar5;
      }
    }
    memset((this->U).pVal + uVar11,-(uint)bVar3,(ulong)(uVar12 << 3));
    clearUnusedBits(this);
    return;
  }
  return;
}

Assistant:

void APInt::ashrSlowCase(unsigned ShiftAmt) {
  // Don't bother performing a no-op shift.
  if (!ShiftAmt)
    return;

  // Save the original sign bit for later.
  bool Negative = isNegative();

  // WordShift is the inter-part shift; BitShift is intra-part shift.
  unsigned WordShift = ShiftAmt / APINT_BITS_PER_WORD;
  unsigned BitShift = ShiftAmt % APINT_BITS_PER_WORD;

  unsigned WordsToMove = getNumWords() - WordShift;
  if (WordsToMove != 0) {
    // Sign extend the last word to fill in the unused bits.
    U.pVal[getNumWords() - 1] = SignExtend64(
        U.pVal[getNumWords() - 1], ((BitWidth - 1) % APINT_BITS_PER_WORD) + 1);

    // Fastpath for moving by whole words.
    if (BitShift == 0) {
      std::memmove(U.pVal, U.pVal + WordShift, WordsToMove * APINT_WORD_SIZE);
    } else {
      // Move the words containing significant bits.
      for (unsigned i = 0; i != WordsToMove - 1; ++i)
        U.pVal[i] = (U.pVal[i + WordShift] >> BitShift) |
                    (U.pVal[i + WordShift + 1] << (APINT_BITS_PER_WORD - BitShift));

      // Handle the last word which has no high bits to copy.
      U.pVal[WordsToMove - 1] = U.pVal[WordShift + WordsToMove - 1] >> BitShift;
      // Sign extend one more time.
      U.pVal[WordsToMove - 1] =
          SignExtend64(U.pVal[WordsToMove - 1], APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder based on the original sign.
  std::memset(U.pVal + WordsToMove, Negative ? -1 : 0,
              WordShift * APINT_WORD_SIZE);
  clearUnusedBits();
}